

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

string * ReplaceLine(string *__return_storage_ptr__,string *s,int line_index,StringRef new_line)

{
  long lVar1;
  Error *this;
  size_type sVar2;
  int iVar3;
  ulong uVar4;
  
  iVar3 = line_index + 1;
  uVar4 = 0;
  do {
    iVar3 = iVar3 + -1;
    if (iVar3 < 1) {
      sVar2 = std::__cxx11::string::find((char)s,10);
      if (sVar2 == 0xffffffffffffffff) {
        sVar2 = s->_M_string_length;
      }
      std::__cxx11::string::replace((ulong)s,uVar4,(char *)(sVar2 - uVar4),(ulong)new_line.data_);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
      return __return_storage_ptr__;
    }
    lVar1 = std::__cxx11::string::find((char)s,10);
    uVar4 = lVar1 + 1;
  } while (uVar4 != 0);
  this = (Error *)__cxa_allocate_exception(0x18);
  mp::Error::Error(this,(CStringRef)0x141ed1,-1);
  __cxa_throw(this,&mp::Error::typeinfo,fmt::SystemError::~SystemError);
}

Assistant:

std::string ReplaceLine(std::string s, int line_index,
                        fmt::StringRef new_line) {
  std::string::size_type start = 0;
  while (line_index-- > 0) {
    start = s.find('\n', start);
    if (start == std::string::npos)
      throw mp::Error("invalid line index");
    ++start;
  }
  std::string::size_type end = s.find('\n', start);
  if (end == std::string::npos)
    end = s.size();
  s.replace(start, end - start, new_line.data(), new_line.size());
  return s;
}